

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O3

bool __thiscall duckdb::BatchedBufferedData::BufferIsEmpty(BatchedBufferedData *this)

{
  mutex *__mutex;
  _Elt_pointer puVar1;
  _Elt_pointer puVar2;
  int iVar3;
  
  __mutex = &(this->super_BufferedData).glock;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    puVar1 = (this->read_queue).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    puVar2 = (this->read_queue).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return puVar1 == puVar2;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

bool BatchedBufferedData::BufferIsEmpty() {
	lock_guard<mutex> lock(glock);
	return read_queue.empty();
}